

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::SPxFastRT<double>::shortEnter
          (SPxFastRT<double> *this,SPxId *enterId,int nr,double max,double maxabs)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SPxSolverBase<double> *pSVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar8 = peVar2->s_epsilon_multiplier;
    uVar7 = -(ulong)(dVar8 == 1.0);
    dVar8 = (double)(~uVar7 & (ulong)(dVar8 * 1e-05) | uVar7 & 0x3ee4f8b588e368f1);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    dVar8 = peVar2->s_epsilon_multiplier;
    uVar7 = -(ulong)(dVar8 == 1.0);
    dVar8 = (double)(~uVar7 & (ulong)(dVar8 * 1e-05) | uVar7 & 0x3ee4f8b588e368f1);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar3 = (this->super_SPxRatioTester<double>).thesolver;
  iVar5 = pSVar3->theRep * (enterId->super_DataKey).info;
  if (iVar5 < 0) {
    lVar6 = 0x6b8;
  }
  else {
    if (iVar5 == 0) {
      bVar4 = 0;
      goto LAB_002160d6;
    }
    lVar6 = 0x6c0;
  }
  if ((max != 0.0) || (NAN(max))) {
    dVar1 = *(double *)
             (*(long *)(*(long *)((long)&(pSVar3->super_SPxLPBase<double>).
                                         super_LPRowSetBase<double>.super_SVSetBase<double>.
                                         super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                 + lVar6) + 0x40) + (long)nr * 8);
    bVar4 = -(dVar8 * maxabs <= -dVar1) | -(dVar8 * maxabs <= dVar1);
  }
  else {
    bVar4 = 1;
  }
LAB_002160d6:
  return (bool)(bVar4 & 1);
}

Assistant:

bool SPxFastRT<R>::shortEnter(
   const SPxId& enterId,
   int nr,
   R max,
   R maxabs) const
{
   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   if(this->thesolver->isCoId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->coPvec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }
   else if(this->thesolver->isId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->pVec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }

   return false;
}